

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__getpwuid_r(uv_passwd_t *pwd,uid_t uid)

{
  int iVar1;
  char *__buffer;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  size_t sVar5;
  passwd *result;
  passwd pw;
  passwd *local_68;
  passwd local_60;
  
  if (pwd == (uv_passwd_t *)0x0) {
    return -0x16;
  }
  sVar5 = 2000;
  __buffer = (char *)uv__malloc(2000);
  if (__buffer != (char *)0x0) {
    do {
      do {
        iVar1 = getpwuid_r(uid,&local_60,__buffer,sVar5,&local_68);
      } while (iVar1 == 4);
      if ((iVar1 != 0) || (local_68 == (passwd *)0x0)) {
        uv__free(__buffer);
      }
      if (iVar1 != 0x22) {
        if (iVar1 != 0) {
          return -iVar1;
        }
        if (local_68 != (passwd *)0x0) {
          sVar5 = strlen(local_60.pw_name);
          sVar5 = sVar5 + 1;
          sVar2 = strlen(local_60.pw_dir);
          sVar2 = sVar2 + 1;
          sVar3 = strlen(local_60.pw_shell);
          sVar3 = sVar3 + 1;
          if (local_60.pw_gecos == (char *)0x0) {
            sVar4 = 0;
          }
          else {
            sVar4 = strlen(local_60.pw_gecos);
            sVar4 = sVar4 + 1;
          }
          __dest = (char *)uv__malloc(sVar3 + sVar4 + sVar2 + sVar5);
          pwd->username = __dest;
          if (__dest == (char *)0x0) {
            uv__free(__buffer);
            return -0xc;
          }
          memcpy(__dest,local_60.pw_name,sVar5);
          pwd->homedir = pwd->username + sVar5;
          memcpy(pwd->username + sVar5,local_60.pw_dir,sVar2);
          pwd->shell = pwd->homedir + sVar2;
          memcpy(pwd->homedir + sVar2,local_60.pw_shell,sVar3);
          if (local_60.pw_gecos == (char *)0x0) {
            pwd->gecos = (char *)0x0;
          }
          else {
            pwd->gecos = pwd->shell + sVar3;
            memcpy(pwd->shell + sVar3,local_60.pw_gecos,sVar4);
          }
          pwd->uid = (ulong)local_60.pw_uid;
          pwd->gid = (ulong)local_60.pw_gid;
          uv__free(__buffer);
          return 0;
        }
        return -2;
      }
      sVar5 = sVar5 * 2;
      __buffer = (char *)uv__malloc(sVar5);
    } while (__buffer != (char *)0x0);
  }
  return -0xc;
}

Assistant:

static int uv__getpwuid_r(uv_passwd_t *pwd, uid_t uid) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  size_t gecos_size;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETPW_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the username, gecos, shell, and home directory. */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;

#ifdef __MVS__
  gecos_size = 0; /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos != NULL)
    gecos_size = strlen(pw.pw_gecos) + 1;
  else
    gecos_size = 0;
#endif

  pwd->username = uv__malloc(name_size +
                             homedir_size +
                             shell_size +
                             gecos_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the gecos field */
#ifdef __MVS__
  pwd->gecos = NULL;  /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos == NULL) {
    pwd->gecos = NULL;
  } else {
    pwd->gecos = pwd->shell + shell_size;
    memcpy(pwd->gecos, pw.pw_gecos, gecos_size);
  }
#endif

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}